

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict try_attr_spec(c2m_ctx_t c2m_ctx,pos_t pos,node_t_conflict *asm_part)

{
  ushort uVar1;
  short sVar2;
  parse_ctx *ppVar3;
  parse_ctx *ppVar4;
  node_t_conflict op;
  int iVar5;
  size_t sVar6;
  node_t_conflict pnVar7;
  node_t_conflict op2;
  token_t ptVar8;
  node_t_conflict pnVar9;
  char *pcVar10;
  parse_ctx_t parse_ctx_2;
  parse_ctx_t parse_ctx_1;
  parse_ctx_t parse_ctx;
  pos_t pVar11;
  str_t sVar12;
  
  if (c2m_ctx->options->pedantic_p != 0) {
    return (node_t_conflict)0x0;
  }
  if (asm_part != (node_t_conflict *)0x0) {
    *asm_part = (node_t_conflict)0x0;
    sVar6 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
    ppVar3 = c2m_ctx->parse_ctx;
    if (*(short *)ppVar3->curr_token == 0x103) {
      pnVar7 = ppVar3->curr_token->node;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pcVar10 = (pnVar7->u).s.s;
      iVar5 = strcmp(pcVar10,"__asm");
      if ((iVar5 != 0) && (iVar5 = strcmp(pcVar10,"asm"), iVar5 != 0)) {
        iVar5 = ppVar3->record_level;
        goto joined_r0x00195b63;
      }
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x28) {
        if (ppVar3->record_level != 0) goto LAB_00195cb5;
        iVar5 = 0x28;
LAB_00195c77:
        pcVar10 = get_token_name(c2m_ctx,iVar5);
        goto LAB_00195b73;
      }
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      ptVar8 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar8 == 0x102) {
        pnVar9 = ptVar8->node;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          pVar11 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                (node_t_conflict)(ulong)pnVar7->uid);
          pnVar7 = new_pos_node1(c2m_ctx,N_ASM,pVar11,pnVar9);
          record_stop(c2m_ctx,sVar6,(uint)(pnVar7 == &err_struct));
          if (pnVar7 != &err_struct) {
            if (c2m_ctx->options->pedantic_p != 0) {
              error(c2m_ctx,0x1c1cc8,pos.fname,pos._8_8_);
            }
            *asm_part = pnVar7;
          }
          goto LAB_00195cc5;
        }
        if (ppVar3->record_level == 0) {
          iVar5 = 0x29;
          goto LAB_00195c77;
        }
      }
      else if (ppVar3->record_level == 0) {
        pcVar10 = "string";
        goto LAB_00195b73;
      }
    }
    else {
      iVar5 = ppVar3->record_level;
joined_r0x00195b63:
      if (iVar5 == 0) {
        pcVar10 = "identifier";
LAB_00195b73:
        syntax_error(c2m_ctx,pcVar10);
      }
    }
LAB_00195cb5:
    record_stop(c2m_ctx,sVar6,1);
  }
LAB_00195cc5:
  sVar6 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
  ppVar3 = c2m_ctx->parse_ctx;
  if (*(short *)ppVar3->curr_token == 0x103) {
    pnVar7 = ppVar3->curr_token->node;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pcVar10 = (pnVar7->u).s.s;
    iVar5 = strcmp(pcVar10,"__attribute__");
    if ((iVar5 == 0) || (iVar5 = strcmp(pcVar10,"__mirc_attribute__"), iVar5 == 0)) {
      if ((*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) &&
         (read_token((c2m_ctx_t)c2m_ctx->recorded_tokens),
         *(short *)c2m_ctx->parse_ctx->curr_token == 0x28)) {
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        pnVar7 = new_node(c2m_ctx,N_LIST);
        do {
          ppVar4 = c2m_ctx->parse_ctx;
          ptVar8 = ppVar4->curr_token;
          iVar5 = *(int *)ptVar8 << 0x10;
          if (iVar5 == 0x290000) {
            pnVar9 = (node_t_conflict)0x0;
          }
          else {
            pnVar9 = (node_t_conflict)0x0;
            if (iVar5 != 0x2c0000) {
              if ((iVar5 >> 0x10) - 0x110U < 0x2d) {
                read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
                sVar12 = uniq_cstr(c2m_ctx,ptVar8->repr);
                pVar11 = ptVar8->pos;
                pnVar9 = new_node(c2m_ctx,N_ID);
                add_pos(c2m_ctx,pnVar9,pVar11);
                (pnVar9->u).s = sVar12;
              }
              else {
                if (iVar5 != 0x1030000) {
LAB_0019601a:
                  iVar5 = ppVar4->record_level;
                  goto joined_r0x0019601f;
                }
                pnVar9 = ptVar8->node;
                read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
              }
              op2 = new_node(c2m_ctx,N_LIST);
              pnVar9 = new_node2(c2m_ctx,N_ATTR,pnVar9,op2);
              if (*(short *)ppVar4->curr_token == 0x28) {
                if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x28) {
                  iVar5 = ppVar4->record_level;
                  goto joined_r0x001960dd;
                }
                do {
                  read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
                  do {
                    uVar1 = *(ushort *)ppVar4->curr_token;
                    if (uVar1 - 0x100 < 3) {
                      ptVar8 = c2m_ctx->parse_ctx->curr_token;
                      if ((int)*(short *)ptVar8 != (uint)uVar1) {
                        if (ppVar4->record_level != 0) goto LAB_00195fe0;
                        iVar5 = (int)(short)uVar1;
                        goto LAB_00195fd0;
                      }
                    }
                    else {
                      if (uVar1 == 0x29) {
                        if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x29) {
                          iVar5 = ppVar4->record_level;
                          goto joined_r0x001960fa;
                        }
                        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
                        goto LAB_00195f7a;
                      }
                      ptVar8 = c2m_ctx->parse_ctx->curr_token;
                      if (*(short *)ptVar8 != 0x103) goto LAB_0019601a;
                    }
                    op = ptVar8->node;
                    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
                    op_append(c2m_ctx,op2,op);
                  } while (*(short *)ppVar4->curr_token == 0x29);
                } while (*(short *)c2m_ctx->parse_ctx->curr_token == 0x2c);
                iVar5 = ppVar4->record_level;
                goto joined_r0x001960ed;
              }
LAB_00195f7a:
              if (pnVar9 == &err_struct) goto LAB_00195fe0;
            }
          }
          op_append(c2m_ctx,pnVar7,pnVar9);
          sVar2 = *(short *)c2m_ctx->parse_ctx->curr_token;
          if (*(short *)ppVar3->curr_token == 0x29) {
            if ((sVar2 == 0x29) &&
               (read_token((c2m_ctx_t)c2m_ctx->recorded_tokens),
               *(short *)c2m_ctx->parse_ctx->curr_token == 0x29)) {
              read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
              record_stop(c2m_ctx,sVar6,(uint)(pnVar7 == &err_struct));
              if (pnVar7 == &err_struct) {
                return &err_struct;
              }
              if (c2m_ctx->options->pedantic_p == 0) {
                return pnVar7;
              }
              error(c2m_ctx,0x1c1cdf,pos.fname,pos._8_8_);
              return pnVar7;
            }
            iVar5 = ppVar3->record_level;
joined_r0x001960fa:
            if (iVar5 != 0) goto LAB_00195fe0;
            iVar5 = 0x29;
            goto LAB_00195fd0;
          }
          if (sVar2 != 0x2c) goto LAB_0019609e;
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        } while( true );
      }
      iVar5 = ppVar3->record_level;
joined_r0x001960dd:
      if (iVar5 != 0) goto LAB_00195fe0;
      iVar5 = 0x28;
      goto LAB_00195fd0;
    }
  }
  iVar5 = ppVar3->record_level;
joined_r0x0019601f:
  if (iVar5 != 0) goto LAB_00195fe0;
  pcVar10 = "identifier";
  goto LAB_00195fdb;
LAB_0019609e:
  iVar5 = ppVar3->record_level;
joined_r0x001960ed:
  if (iVar5 != 0) goto LAB_00195fe0;
  iVar5 = 0x2c;
LAB_00195fd0:
  pcVar10 = get_token_name(c2m_ctx,iVar5);
LAB_00195fdb:
  syntax_error(c2m_ctx,pcVar10);
LAB_00195fe0:
  record_stop(c2m_ctx,sVar6,1);
  return &err_struct;
}

Assistant:

static node_t try_attr_spec (c2m_ctx_t c2m_ctx, pos_t pos, node_t *asm_part) {
  node_t r;

  if (c2m_options->pedantic_p) return NULL;
  if (asm_part != NULL) {
    *asm_part = NULL;
    if ((r = TRY (asm_spec)) != err_node) {
      if (c2m_options->pedantic_p)
        error (c2m_ctx, pos, "asm is not implemented");
      else {
        /*warning (c2m_ctx, pos, "asm is not implemented -- ignoring it")*/
      }
      *asm_part = r;
    }
  }
  if ((r = TRY (attr_spec)) != err_node) {
    if (c2m_options->pedantic_p)
      error (c2m_ctx, pos, "GCC attributes are not implemented");
    else {
      /*warning (c2m_ctx, pos, "GCC attributes are not implemented -- ignoring them")*/
    }
  }
  return r;
}